

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

opj_image_t * bmp8toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT8 **pLUT)

{
  byte bVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_UINT8 *pOVar4;
  OPJ_UINT8 *pOVar5;
  OPJ_UINT8 *pOVar6;
  OPJ_INT32 *pOVar7;
  ulong uVar8;
  ulong uVar9;
  OPJ_INT32 *pOVar10;
  OPJ_UINT32 y;
  OPJ_UINT32 OVar11;
  OPJ_UINT8 *pOVar12;
  OPJ_INT32 *pOVar13;
  
  poVar3 = image->comps;
  uVar2 = poVar3->w;
  uVar8 = (ulong)uVar2;
  OVar11 = poVar3->h;
  pOVar12 = pData + (OVar11 - 1) * stride;
  pOVar4 = *pLUT;
  if (image->numcomps == 1) {
    if (OVar11 != 0) {
      pOVar7 = poVar3->data;
      do {
        if (uVar2 != 0) {
          uVar9 = 0;
          do {
            pOVar7[uVar9] = (uint)pOVar4[pOVar12[uVar9]];
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        pOVar12 = pOVar12 + (int)-stride;
        pOVar7 = pOVar7 + (int)uVar2;
        OVar11 = OVar11 - 1;
      } while (OVar11 != 0);
    }
  }
  else if (OVar11 != 0) {
    pOVar5 = pLUT[1];
    pOVar6 = pLUT[2];
    pOVar7 = poVar3[2].data;
    pOVar10 = poVar3->data;
    pOVar13 = poVar3[1].data;
    do {
      if (uVar8 != 0) {
        uVar9 = 0;
        do {
          bVar1 = pOVar12[uVar9];
          pOVar10[uVar9] = (uint)pOVar4[bVar1];
          pOVar13[uVar9] = (uint)pOVar5[bVar1];
          pOVar7[uVar9] = (uint)pOVar6[bVar1];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      pOVar12 = pOVar12 + (int)-stride;
      pOVar7 = pOVar7 + (int)uVar2;
      pOVar13 = pOVar13 + (int)uVar2;
      pOVar10 = pOVar10 + (int)uVar2;
      OVar11 = OVar11 - 1;
    } while (OVar11 != 0);
  }
  return image;
}

Assistant:

static opj_image_t* bmp8toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride, opj_image_t* image, OPJ_UINT8 const* const* pLUT)
{
	OPJ_UINT32 width, height;
	const OPJ_UINT8 *pSrc = NULL;
	
	width  = image->comps[0].w;
	height = image->comps[0].h;
	
	pSrc = pData + (height - 1U) * stride;
	if (image->numcomps == 1U) {
		opj_applyLUT8u_8u32s_C1R(pSrc, -(OPJ_INT32)stride, image->comps[0].data, (OPJ_INT32)width, pLUT[0], width, height);
	}
	else {
		OPJ_INT32* pDst[3];
		OPJ_INT32  pDstStride[3];
		
		pDst[0] = image->comps[0].data; pDst[1] = image->comps[1].data; pDst[2] = image->comps[2].data;
		pDstStride[0] = (OPJ_INT32)width; pDstStride[1] = (OPJ_INT32)width; pDstStride[2] = (OPJ_INT32)width;
		opj_applyLUT8u_8u32s_C1P3R(pSrc, -(OPJ_INT32)stride, pDst, pDstStride, pLUT, width, height);
	}
	return image;
}